

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

opj_pi_iterator_t * pi_create_decode(opj_image_t *image,opj_cp_t *cp,int tileno)

{
  opj_poc_t *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  OPJ_PROG_ORDER OVar8;
  opj_tcp_t *poVar9;
  opj_tccp_t *poVar10;
  opj_image_comp_t *poVar11;
  int iVar12;
  uint uVar13;
  opj_pi_iterator_t *pi;
  opj_pi_comp_t *poVar14;
  ulong uVar15;
  opj_pi_resolution_t *poVar16;
  ulong uVar17;
  short *psVar18;
  OPJ_UINT32 *pOVar19;
  byte bVar20;
  byte bVar21;
  ulong uVar22;
  OPJ_PROG_ORDER *pOVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  OPJ_UINT32 OVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  uint uVar39;
  undefined8 uVar40;
  long local_98;
  
  poVar9 = cp->tcps;
  iVar2 = poVar9[tileno].numpocs;
  pi = (opj_pi_iterator_t *)calloc((long)iVar2 + 1,0xf8);
  if (pi == (opj_pi_iterator_t *)0x0) {
LAB_00127fb6:
    pi = (opj_pi_iterator_t *)0x0;
  }
  else {
    for (lVar28 = 0; lVar28 <= iVar2; lVar28 = lVar28 + 1) {
      iVar12 = tileno / cp->tw;
      iVar24 = tileno % cp->tw;
      iVar37 = cp->tx0;
      iVar3 = cp->tdx;
      OVar29 = iVar3 * iVar24 + iVar37;
      if ((int)OVar29 <= (int)image->x0) {
        OVar29 = image->x0;
      }
      pi[lVar28].tx0 = OVar29;
      iVar4 = cp->ty0;
      iVar34 = cp->tdy;
      OVar29 = iVar34 * iVar12 + iVar4;
      if ((int)OVar29 <= (int)image->y0) {
        OVar29 = image->y0;
      }
      pi[lVar28].ty0 = OVar29;
      OVar29 = (iVar24 + 1) * iVar3 + iVar37;
      if ((int)image->x1 <= (int)OVar29) {
        OVar29 = image->x1;
      }
      pi[lVar28].tx1 = OVar29;
      OVar29 = (iVar12 + 1) * iVar34 + iVar4;
      if ((int)image->y1 <= (int)OVar29) {
        OVar29 = image->y1;
      }
      pi[lVar28].ty1 = OVar29;
      uVar32 = image->numcomps;
      pi[lVar28].numcomps = uVar32;
      poVar14 = (opj_pi_comp_t *)calloc((ulong)uVar32,0x18);
      pi[lVar28].comps = poVar14;
      if (poVar14 == (opj_pi_comp_t *)0x0) {
LAB_00127fb1:
        pi_destroy(pi,cp,tileno);
        goto LAB_00127fb6;
      }
      uVar22 = 0;
      uVar15 = (ulong)(uint)pi->numcomps;
      if (pi->numcomps < 1) {
        uVar15 = uVar22;
      }
      local_98 = 0x3b0;
      iVar37 = 0;
      uVar35 = 0;
      for (; OVar29 = (OPJ_UINT32)uVar35, uVar22 != uVar15; uVar22 = uVar22 + 1) {
        poVar10 = poVar9[tileno].tccps;
        poVar11 = image->comps;
        OVar5 = poVar11[uVar22].dx;
        poVar14[uVar22].dx = OVar5;
        OVar6 = poVar11[uVar22].dy;
        poVar14[uVar22].dy = OVar6;
        uVar7 = poVar10[uVar22].numresolutions;
        poVar14[uVar22].numresolutions = uVar7;
        poVar16 = (opj_pi_resolution_t *)calloc((long)(int)uVar7,0x10);
        poVar14[uVar22].resolutions = poVar16;
        if (poVar16 == (opj_pi_resolution_t *)0x0) goto LAB_00127fb1;
        iVar3 = pi->tx0;
        iVar12 = pi->ty0;
        iVar24 = pi->tx1;
        iVar4 = pi->ty1;
        uVar17 = 0;
        if (0 < (int)uVar7) {
          uVar17 = (ulong)uVar7;
        }
        uVar25 = uVar7;
        for (lVar36 = 0; uVar25 = uVar25 - 1, uVar17 << 2 != lVar36; lVar36 = lVar36 + 4) {
          if ((poVar10[uVar22].csty & 1) == 0) {
            (&poVar16->pdx)[lVar36] = 0xf;
            iVar33 = 0xf;
            iVar34 = 0xf;
          }
          else {
            iVar34 = *(int *)((long)poVar10 + lVar36 + local_98 + -0x84);
            (&poVar16->pdx)[lVar36] = iVar34;
            iVar33 = *(int *)((long)poVar10->stepsizes + lVar36 + local_98 + -0x1c);
          }
          bVar20 = (byte)uVar25;
          iVar38 = 1 << (bVar20 & 0x1f);
          uVar26 = (int)(iVar3 + (OVar5 - 1)) / (int)OVar5 + -1 + iVar38 >> (bVar20 & 0x1f);
          uVar27 = (int)(iVar12 + (OVar6 - 1)) / (int)OVar6 + -1 + iVar38 >> (bVar20 & 0x1f);
          uVar30 = (int)((OVar5 - 1) + iVar24) / (int)OVar5 + -1 + iVar38 >> (bVar20 & 0x1f);
          uVar39 = iVar38 + (int)((OVar6 - 1) + iVar4) / (int)OVar6 + -1 >> (bVar20 & 0x1f);
          bVar20 = (byte)iVar33;
          uVar31 = -1 << (bVar20 & 0x1f);
          bVar21 = (byte)iVar34;
          uVar13 = -1 << (bVar21 & 0x1f);
          iVar34 = (int)((((1 << (bVar21 & 0x1f)) + uVar30) - 1 & uVar13) - (uVar13 & uVar26)) >>
                   (bVar21 & 0x1f);
          if (uVar26 == uVar30) {
            iVar34 = 0;
          }
          (&poVar16->pdy)[lVar36] = iVar33;
          iVar33 = (int)(((uVar39 + (1 << (bVar20 & 0x1f))) - 1 & uVar31) - (uVar31 & uVar27)) >>
                   (bVar20 & 0x1f);
          if (uVar27 == uVar39) {
            iVar33 = 0;
          }
          (&poVar16->pw)[lVar36] = iVar34;
          (&poVar16->ph)[lVar36] = iVar33;
          if (iVar37 < iVar33 * iVar34) {
            iVar37 = iVar33 * iVar34;
          }
        }
        if ((int)OVar29 < (int)uVar7) {
          uVar35 = (ulong)uVar7;
        }
        local_98 = local_98 + 0x438;
      }
      pi[lVar28].step_p = 1;
      pi[lVar28].step_c = iVar37;
      pi[lVar28].step_r = uVar32 * iVar37;
      pi[lVar28].step_l = uVar32 * iVar37 * OVar29;
      if (lVar28 == 0) {
        psVar18 = (short *)calloc((ulong)(OVar29 * iVar37 * uVar32 * poVar9[tileno].numlayers),2);
        pi->include = psVar18;
        if (psVar18 == (short *)0x0) goto LAB_00127fb1;
      }
      else {
        pi[lVar28].include = pi[lVar28 + -1].include;
      }
      if (poVar9[tileno].POC == 0) {
        uVar40 = 0;
        pOVar19 = (OPJ_UINT32 *)&poVar9[tileno].numlayers;
        pOVar23 = &poVar9[tileno].prg;
      }
      else {
        poVar1 = poVar9[tileno].pocs + lVar28;
        uVar40._0_4_ = poVar1->resno0;
        uVar40._4_4_ = poVar1->compno0;
        OVar29 = poVar1->resno1;
        uVar32 = poVar1->compno1;
        pOVar19 = &poVar1->layno1;
        pOVar23 = &poVar9[tileno].pocs[lVar28].prg;
      }
      OVar8 = *pOVar23;
      OVar5 = *pOVar19;
      pi[lVar28].first = 1;
      pi[lVar28].poc.resno0 = (int)uVar40;
      pi[lVar28].poc.compno0 = (int)((ulong)uVar40 >> 0x20);
      pi[lVar28].poc.layno1 = OVar5;
      pi[lVar28].poc.resno1 = OVar29;
      pi[lVar28].poc.compno1 = uVar32;
      pi[lVar28].poc.prg = OVar8;
      pi[lVar28].poc.layno0 = 0;
      pi[lVar28].poc.precno0 = 0;
      pi[lVar28].poc.precno1 = iVar37;
    }
  }
  return pi;
}

Assistant:

opj_pi_iterator_t *pi_create_decode(opj_image_t *image, opj_cp_t *cp, int tileno) {
	int p, q;
	int compno, resno, pino;
	opj_pi_iterator_t *pi = NULL;
	opj_tcp_t *tcp = NULL;
	opj_tccp_t *tccp = NULL;

	tcp = &cp->tcps[tileno];

	pi = (opj_pi_iterator_t*) opj_calloc((tcp->numpocs + 1), sizeof(opj_pi_iterator_t));
	if(!pi) {
		/* TODO: throw an error */
		return NULL;
	}

	for (pino = 0; pino < tcp->numpocs + 1; pino++) {	/* change */
		int maxres = 0;
		int maxprec = 0;
		p = tileno % cp->tw;
		q = tileno / cp->tw;

		pi[pino].tx0 = int_max(cp->tx0 + p * cp->tdx, image->x0);
		pi[pino].ty0 = int_max(cp->ty0 + q * cp->tdy, image->y0);
		pi[pino].tx1 = int_min(cp->tx0 + (p + 1) * cp->tdx, image->x1);
		pi[pino].ty1 = int_min(cp->ty0 + (q + 1) * cp->tdy, image->y1);
		pi[pino].numcomps = image->numcomps;

		pi[pino].comps = (opj_pi_comp_t*) opj_calloc(image->numcomps, sizeof(opj_pi_comp_t));
		if(!pi[pino].comps) {
			/* TODO: throw an error */
			pi_destroy(pi, cp, tileno);
			return NULL;
		}
		
		for (compno = 0; compno < pi->numcomps; compno++) {
			int tcx0, tcy0, tcx1, tcy1;
			opj_pi_comp_t *comp = &pi[pino].comps[compno];
			tccp = &tcp->tccps[compno];
			comp->dx = image->comps[compno].dx;
			comp->dy = image->comps[compno].dy;
			comp->numresolutions = tccp->numresolutions;

			comp->resolutions = (opj_pi_resolution_t*) opj_calloc(comp->numresolutions, sizeof(opj_pi_resolution_t));
			if(!comp->resolutions) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}

			tcx0 = int_ceildiv(pi->tx0, comp->dx);
			tcy0 = int_ceildiv(pi->ty0, comp->dy);
			tcx1 = int_ceildiv(pi->tx1, comp->dx);
			tcy1 = int_ceildiv(pi->ty1, comp->dy);
			if (comp->numresolutions > maxres) {
				maxres = comp->numresolutions;
			}

			for (resno = 0; resno < comp->numresolutions; resno++) {
				int levelno;
				int rx0, ry0, rx1, ry1;
				int px0, py0, px1, py1;
				opj_pi_resolution_t *res = &comp->resolutions[resno];
				if (tccp->csty & J2K_CCP_CSTY_PRT) {
					res->pdx = tccp->prcw[resno];
					res->pdy = tccp->prch[resno];
				} else {
					res->pdx = 15;
					res->pdy = 15;
				}
				levelno = comp->numresolutions - 1 - resno;
				rx0 = int_ceildivpow2(tcx0, levelno);
				ry0 = int_ceildivpow2(tcy0, levelno);
				rx1 = int_ceildivpow2(tcx1, levelno);
				ry1 = int_ceildivpow2(tcy1, levelno);
				px0 = int_floordivpow2(rx0, res->pdx) << res->pdx;
				py0 = int_floordivpow2(ry0, res->pdy) << res->pdy;
				px1 = int_ceildivpow2(rx1, res->pdx) << res->pdx;
				py1 = int_ceildivpow2(ry1, res->pdy) << res->pdy;
				res->pw = (rx0==rx1)?0:((px1 - px0) >> res->pdx);
				res->ph = (ry0==ry1)?0:((py1 - py0) >> res->pdy);
				
				if (res->pw*res->ph > maxprec) {
					maxprec = res->pw*res->ph;
				}
				
			}
		}
		
		tccp = &tcp->tccps[0];
		pi[pino].step_p = 1;
		pi[pino].step_c = maxprec * pi[pino].step_p;
		pi[pino].step_r = image->numcomps * pi[pino].step_c;
		pi[pino].step_l = maxres * pi[pino].step_r;
		
		if (pino == 0) {
			pi[pino].include = (short int*) opj_calloc(image->numcomps * maxres * tcp->numlayers * maxprec, sizeof(short int));
			if(!pi[pino].include) {
				/* TODO: throw an error */
				pi_destroy(pi, cp, tileno);
				return NULL;
			}
		}
		else {
			pi[pino].include = pi[pino - 1].include;
		}
		
		if (tcp->POC == 0) {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = 0;
			pi[pino].poc.compno0 = 0;
			pi[pino].poc.layno1 = tcp->numlayers;
			pi[pino].poc.resno1 = maxres;
			pi[pino].poc.compno1 = image->numcomps;
			pi[pino].poc.prg = tcp->prg;
		} else {
			pi[pino].first = 1;
			pi[pino].poc.resno0 = tcp->pocs[pino].resno0;
			pi[pino].poc.compno0 = tcp->pocs[pino].compno0;
			pi[pino].poc.layno1 = tcp->pocs[pino].layno1;
			pi[pino].poc.resno1 = tcp->pocs[pino].resno1;
			pi[pino].poc.compno1 = tcp->pocs[pino].compno1;
			pi[pino].poc.prg = tcp->pocs[pino].prg;
		}
		pi[pino].poc.layno0  = 0;
		pi[pino].poc.precno0 = 0; 
		pi[pino].poc.precno1 = maxprec;
			
	}
	
	return pi;
}